

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall cmTarget::PushTLLCommandTrace(cmTarget *this,TLLSignature signature)

{
  byte bVar1;
  bool bVar2;
  reference pvVar3;
  pair<cmTarget::TLLSignature,_cmListFileContext> local_c0;
  undefined1 local_60 [8];
  cmListFileContext lfc;
  bool ret;
  TLLSignature signature_local;
  cmTarget *this_local;
  
  lfc.Line._3_1_ = 1;
  lfc.Line._4_4_ = signature;
  bVar2 = std::
          vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
          ::empty(&this->TLLCommands);
  if ((!bVar2) &&
     (pvVar3 = std::
               vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
               ::back(&this->TLLCommands), pvVar3->first != lfc.Line._4_4_)) {
    lfc.Line._3_1_ = 0;
  }
  cmMakefile::GetExecutionContext((cmListFileContext *)local_60,this->Makefile);
  bVar2 = std::
          vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
          ::empty(&this->TLLCommands);
  if (!bVar2) {
    pvVar3 = std::
             vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
             ::back(&this->TLLCommands);
    bVar2 = ::operator!=(&pvVar3->second,(cmListFileContext *)local_60);
    if (!bVar2) goto LAB_0052443b;
  }
  std::make_pair<cmTarget::TLLSignature&,cmListFileContext&>
            (&local_c0,(TLLSignature *)((long)&lfc.Line + 4),(cmListFileContext *)local_60);
  std::
  vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
  ::push_back(&this->TLLCommands,&local_c0);
  std::pair<cmTarget::TLLSignature,_cmListFileContext>::~pair(&local_c0);
LAB_0052443b:
  bVar1 = lfc.Line._3_1_;
  cmListFileContext::~cmListFileContext((cmListFileContext *)local_60);
  return (bool)(bVar1 & 1);
}

Assistant:

bool cmTarget::PushTLLCommandTrace(TLLSignature signature)
{
  bool ret = true;
  if (!this->TLLCommands.empty())
    {
    if (this->TLLCommands.back().first != signature)
      {
      ret = false;
      }
    }
  cmListFileContext lfc = this->Makefile->GetExecutionContext();
  if (this->TLLCommands.empty() || this->TLLCommands.back().second != lfc)
    {
    this->TLLCommands.push_back(std::make_pair(signature, lfc));
    }
  return ret;
}